

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_absolute_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,MemoryAccess access)

{
  anon_class_8_1_8991fb9c local_d0;
  StepT local_c8;
  anon_class_8_1_8991fb9c local_a8;
  StepT local_a0;
  anon_class_8_1_8991fb9c local_80;
  StepT local_78;
  anon_class_8_1_8991fb9c local_48;
  StepT local_40;
  undefined1 local_1d;
  MemoryAccess local_1c;
  Mos6502 *pMStack_18;
  MemoryAccess access_local;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_1d = 0;
  local_1c = access;
  pMStack_18 = this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  Pipeline::Pipeline(__return_storage_ptr__);
  local_48.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_absolute_addressing_steps(n_e_s::core::MemoryAccess)::__0,void>
            ((function<void()> *)&local_40,&local_48);
  Pipeline::push(__return_storage_ptr__,&local_40);
  std::function<void_()>::~function(&local_40);
  local_80.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_absolute_addressing_steps(n_e_s::core::MemoryAccess)::__1,void>
            ((function<void()> *)&local_78,&local_80);
  Pipeline::push(__return_storage_ptr__,&local_78);
  std::function<void_()>::~function(&local_78);
  if (local_1c == ReadWrite) {
    local_a8.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_absolute_addressing_steps(n_e_s::core::MemoryAccess)::__2,void>
              ((function<void()> *)&local_a0,&local_a8);
    Pipeline::push(__return_storage_ptr__,&local_a0);
    std::function<void_()>::~function(&local_a0);
    local_d0.this = this;
    std::function<void()>::
    function<n_e_s::core::Mos6502::create_absolute_addressing_steps(n_e_s::core::MemoryAccess)::__3,void>
              ((function<void()> *)&local_c8,&local_d0);
    Pipeline::push(__return_storage_ptr__,&local_c8);
    std::function<void_()>::~function(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_absolute_addressing_steps(const MemoryAccess access) {
    Pipeline result;
    result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
    result.push([this] {
        const uint16_t upper = mmu_->read_byte(registers_->pc++) << 8u;
        effective_address_ = upper | tmp_;
    });
    if (access == MemoryAccess::ReadWrite) {
        result.push([this] { tmp_ = mmu_->read_byte(effective_address_); });
        result.push([this] {
            // Extra write with the old value
            mmu_->write_byte(effective_address_, tmp_);
        });
    }
    return result;
}